

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_import(ptls_context_t *ctx,ptls_t **tls,ptls_iovec_t params)

{
  ushort uVar1;
  ushort uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  ptls_t *ppVar7;
  ulong uVar8;
  ptls_cipher_suite_t *ppVar9;
  ptls_key_schedule_t *ppVar10;
  ushort uVar11;
  ulong uVar12;
  ushort *puVar13;
  byte *pbVar14;
  ushort *puVar15;
  ushort *puVar16;
  ushort *local_38;
  
  uVar12 = params.len;
  puVar13 = (ushort *)params.base;
  *tls = (ptls_t *)0x0;
  if (uVar12 < 2) {
    return 0x32;
  }
  uVar8 = (ulong)(ushort)(*puVar13 << 8 | *puVar13 >> 8);
  iVar6 = 0x32;
  if ((uVar12 - 2 < uVar8) || (uVar8 < 2)) goto LAB_0010edc6;
  ppVar7 = new_instance(ctx,(uint)(byte)puVar13[1]);
  *tls = ppVar7;
  if (ppVar7 == (ptls_t *)0x0) {
    return 0x201;
  }
  pbVar14 = (byte *)((long)(puVar13 + 1) + uVar8);
  ppVar7->field_0x1e8 = ppVar7->field_0x1e8 & 0xfd | *(char *)((long)puVar13 + 3) * '\x02' & 2U;
  if ((((long)(pbVar14 + (-4 - (long)puVar13)) < 2) || ((long)(pbVar14 + (-6 - (long)puVar13)) < 2))
     || ((long)pbVar14 - (long)(puVar13 + 4) < 0x20)) {
LAB_0010edc3:
    iVar6 = 0x32;
  }
  else {
    uVar1 = puVar13[2];
    uVar2 = puVar13[3];
    ppVar7 = *tls;
    uVar3 = *(undefined8 *)(puVar13 + 4);
    uVar4 = *(undefined8 *)(puVar13 + 8);
    uVar5 = *(undefined8 *)(puVar13 + 0x10);
    *(undefined8 *)(ppVar7->client_random + 0x10) = *(undefined8 *)(puVar13 + 0xc);
    *(undefined8 *)(ppVar7->client_random + 0x18) = uVar5;
    *(undefined8 *)ppVar7->client_random = uVar3;
    *(undefined8 *)(ppVar7->client_random + 8) = uVar4;
    if (pbVar14 + (-0x28 - (long)puVar13) < (byte *)0x2) goto LAB_0010edc3;
    uVar8 = (ulong)(ushort)(puVar13[0x14] << 8 | puVar13[0x14] >> 8);
    puVar15 = puVar13 + 0x15;
    if ((ulong)((long)pbVar14 - (long)puVar15) < uVar8) goto LAB_0010edc3;
    puVar16 = (ushort *)((long)puVar15 + uVar8);
    if (uVar8 == 0) {
      if (puVar15 != puVar16) goto LAB_0010edc3;
    }
    else {
      iVar6 = ptls_set_server_name(*tls,(char *)puVar15,uVar8);
      if (iVar6 != 0) goto LAB_0010edc6;
    }
    if ((ulong)((long)pbVar14 - (long)puVar16) < 2) goto LAB_0010edc3;
    uVar8 = (ulong)(ushort)(*puVar16 << 8 | *puVar16 >> 8);
    puVar16 = puVar16 + 1;
    if ((ulong)((long)pbVar14 - (long)puVar16) < uVar8) goto LAB_0010edc3;
    puVar15 = (ushort *)((long)puVar16 + uVar8);
    if (uVar8 == 0) {
      if (puVar16 != puVar15) goto LAB_0010edc3;
    }
    else {
      iVar6 = ptls_set_negotiated_protocol(*tls,(char *)puVar16,uVar8);
      puVar16 = puVar15;
      if (iVar6 != 0) goto LAB_0010edc6;
    }
    if ((ulong)((long)pbVar14 - (long)puVar15) < 2) goto LAB_0010edc3;
    uVar8 = (ulong)(ushort)(*puVar16 << 8 | *puVar16 >> 8);
    local_38 = puVar16 + 1;
    if ((ulong)((long)pbVar14 - (long)local_38) < uVar8) goto LAB_0010edc3;
    uVar11 = uVar1 << 8 | uVar1 >> 8;
    uVar1 = uVar2 << 8 | uVar2 >> 8;
    puVar15 = (ushort *)((long)local_38 + uVar8);
    if (uVar11 == 0x304) {
      ppVar9 = ptls_find_cipher_suite(ctx->cipher_suites,uVar1);
      (*tls)->cipher_suite = ppVar9;
      ppVar7 = *tls;
      if (ppVar7->cipher_suite == (ptls_cipher_suite_t *)0x0) {
LAB_0010f028:
        iVar6 = 0x28;
        goto LAB_0010edce;
      }
      ppVar10 = key_schedule_new(ppVar7->cipher_suite,(ptls_cipher_suite_t **)0x0,
                                 (uint)((ppVar7->ech).aead != (ptls_aead_context_t *)0x0));
      (*tls)->key_schedule = ppVar10;
      if (ppVar10 == (ptls_key_schedule_t *)0x0) {
        iVar6 = 0x201;
      }
      else {
        iVar6 = import_tls13_traffic_protection(*tls,1,(uint8_t **)&local_38,(uint8_t *)puVar15);
        if (iVar6 == 0) {
          iVar6 = import_tls13_traffic_protection(*tls,0,(uint8_t **)&local_38,(uint8_t *)puVar15);
LAB_0010efa5:
          if (iVar6 == 0) {
            if (((local_38 != puVar15) || ((ulong)((long)pbVar14 - (long)puVar15) < 2)) ||
               ((uVar8 = (ulong)(ushort)(*local_38 << 8 | *local_38 >> 8),
                (ulong)((long)pbVar14 - (long)(local_38 + 1)) < uVar8 ||
                ((byte *)((long)local_38 + uVar8 + 2) != pbVar14)))) goto LAB_0010edc3;
            iVar6 = 0x32;
            if (pbVar14 == (byte *)((long)puVar13 + uVar12)) {
              (*tls)->state = ((byte)(*tls)->field_0x1e8 & 1) + PTLS_STATE_CLIENT_POST_HANDSHAKE;
              return 0;
            }
          }
        }
      }
    }
    else if (uVar11 == 0x303) {
      ppVar9 = ptls_find_cipher_suite(ctx->tls12_cipher_suites,uVar1);
      (*tls)->cipher_suite = ppVar9;
      ppVar7 = *tls;
      if (ppVar7->cipher_suite == (ptls_cipher_suite_t *)0x0) goto LAB_0010f028;
      iVar6 = import_tls12_traffic_protection(ppVar7,1,(uint8_t **)&local_38,(uint8_t *)puVar15);
      if (iVar6 == 0) {
        iVar6 = import_tls12_traffic_protection(*tls,0,(uint8_t **)&local_38,(uint8_t *)puVar15);
        goto LAB_0010efa5;
      }
    }
    else {
      iVar6 = 0x2f;
    }
  }
LAB_0010edc6:
  ppVar7 = *tls;
  if (ppVar7 == (ptls_t *)0x0) {
    return iVar6;
  }
LAB_0010edce:
  ptls_free(ppVar7);
  *tls = (ptls_t *)0x0;
  return iVar6;
}

Assistant:

int ptls_import(ptls_context_t *ctx, ptls_t **tls, ptls_iovec_t params)
{
    const uint8_t *src = params.base, *const end = src + params.len;
    uint16_t protocol_version, csid;
    int ret;

    *tls = NULL;

    /* TODO handle flags like psk_handshake, ech_handshake as we add support for TLS/1.3 import */
    ptls_decode_block(src, end, 2, {
        /* instantiate, based on the is_server flag */
        if (end - src < 2) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        if ((*tls = new_instance(ctx, *src++)) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        (*tls)->is_psk_handshake = *src++;
        /* determine protocol version and cipher suite */
        if ((ret = ptls_decode16(&protocol_version, &src, end)) != 0)
            goto Exit;
        if ((ret = ptls_decode16(&csid, &src, end)) != 0)
            goto Exit;
        /* other version-independent stuff */
        if (end - src < PTLS_HELLO_RANDOM_SIZE) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        memcpy((*tls)->client_random, src, PTLS_HELLO_RANDOM_SIZE);
        src += PTLS_HELLO_RANDOM_SIZE;
        ptls_decode_open_block(src, end, 2, {
            if (src != end) {
                if ((ret = ptls_set_server_name(*tls, (const char *)src, end - src)) != 0)
                    goto Exit;
                src = end;
            }
        });
        ptls_decode_open_block(src, end, 2, {
            if (src != end) {
                if ((ret = ptls_set_negotiated_protocol(*tls, (const char *)src, end - src)) != 0)
                    goto Exit;
                src = end;
            }
        });
        /* version-dependent stuff */
        ptls_decode_open_block(src, end, 2, {
            switch (protocol_version) {
            case PTLS_PROTOCOL_VERSION_TLS12:
                (*tls)->cipher_suite = ptls_find_cipher_suite(ctx->tls12_cipher_suites, csid);
                if ((*tls)->cipher_suite == NULL) {
                    ret = PTLS_ALERT_HANDSHAKE_FAILURE;
                    goto Exit;
                }
                /* setup AEAD keys */
                if ((ret = import_tls12_traffic_protection(*tls, 1, &src, end)) != 0)
                    goto Exit;
                if ((ret = import_tls12_traffic_protection(*tls, 0, &src, end)) != 0)
                    goto Exit;
                break;
            case PTLS_PROTOCOL_VERSION_TLS13:
                (*tls)->cipher_suite = ptls_find_cipher_suite(ctx->cipher_suites, csid);
                if ((*tls)->cipher_suite == NULL) {
                    ret = PTLS_ALERT_HANDSHAKE_FAILURE;
                    goto Exit;
                }
                /* setup AEAD keys */
                if (((*tls)->key_schedule = key_schedule_new((*tls)->cipher_suite, NULL, (*tls)->ech.aead != NULL)) == NULL) {
                    ret = PTLS_ERROR_NO_MEMORY;
                    goto Exit;
                }
                if ((ret = import_tls13_traffic_protection(*tls, 1, &src, end)) != 0)
                    goto Exit;
                if ((ret = import_tls13_traffic_protection(*tls, 0, &src, end)) != 0)
                    goto Exit;
                break;
            default:
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
        });
        /* extensions */
        ptls_decode_open_block(src, end, 2, {
            src = end; /* unused */
        });
    });

    (*tls)->state = ptls_is_server(*tls) ? PTLS_STATE_SERVER_POST_HANDSHAKE : PTLS_STATE_CLIENT_POST_HANDSHAKE;

Exit:
    if (ret != 0) {
        if (*tls != NULL) {
            ptls_free(*tls);
            *tls = NULL;
        }
    }
    return ret;
}